

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurfaceAccess.hpp
# Opt level: O2

RGBA tcu::toRGBAMasked(Vec4 *v,deUint8 mask)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = 0;
  uVar5 = 0;
  if ((mask & 1) != 0) {
    bVar1 = floatToU8(v->m_data[0]);
    uVar5 = (uint)bVar1;
  }
  if ((mask & 2) != 0) {
    bVar1 = floatToU8(v->m_data[1]);
    uVar3 = (uint)bVar1 << 8;
  }
  uVar4 = 0;
  if ((mask & 4) != 0) {
    bVar1 = floatToU8(v->m_data[2]);
    uVar4 = (uint)bVar1 << 0x10;
  }
  uVar2 = 0xff000000;
  if ((mask & 8) != 0) {
    bVar1 = floatToU8(v->m_data[3]);
    uVar2 = (uint)bVar1 << 0x18;
  }
  return (RGBA)(uVar3 | uVar5 | uVar4 | uVar2);
}

Assistant:

inline tcu::RGBA toRGBAMasked (const tcu::Vec4& v, deUint8 mask)
{
	return tcu::RGBA((mask&tcu::RGBA::RED_MASK)		? tcu::floatToU8(v.x()) : 0,
					 (mask&tcu::RGBA::GREEN_MASK)	? tcu::floatToU8(v.y()) : 0,
					 (mask&tcu::RGBA::BLUE_MASK)	? tcu::floatToU8(v.z()) : 0,
					 (mask&tcu::RGBA::ALPHA_MASK)	? tcu::floatToU8(v.w()) : 0xFF); //!< \note Alpha defaults to full saturation when reading masked format
}